

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fASTCDecompressionCases.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ASTCBlockCase2D::init(ASTCBlockCase2D *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  ostringstream *this_01;
  ASTCRenderer2D *this_02;
  int iVar1;
  undefined1 local_320 [120];
  ios_base local_2a8 [264];
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  this_02 = (this->m_renderer).
            super_UniqueBase<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D,_de::DefaultDeleter<deqp::gles3::Functional::ASTCDecompressionCaseInternal::ASTCRenderer2D>_>
            .m_data.ptr;
  tcu::astc::getBlockTestTypeColorScale(this->m_testType);
  tcu::astc::getBlockTestTypeColorBias(this->m_testType);
  ASTCDecompressionCaseInternal::ASTCRenderer2D::initialize
            (this_02,0x40,0x40,(Vec4 *)local_1a0,(Vec4 *)local_320);
  tcu::astc::generateBlockCaseTestData(&this->m_blockData,this->m_format,this->m_testType);
  local_320._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_320 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Total ",6);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," blocks to test",0xf);
  local_1a0._0_8_ =
       tcu::MessageBuilder::operator<<
                 ((MessageBuilder *)local_320,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_01 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,
             "Note: Legitimate ASTC error pixels will be ignored when comparing to reference",0x4e);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_01);
  std::ios_base::~ios_base(local_128);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar1 = std::ios_base::~ios_base(local_2a8);
  return iVar1;
}

Assistant:

void ASTCBlockCase2D::init (void)
{
	m_renderer->initialize(64, 64, tcu::astc::getBlockTestTypeColorScale(m_testType), tcu::astc::getBlockTestTypeColorBias(m_testType));

	generateBlockCaseTestData(m_blockData, m_format, m_testType);
	DE_ASSERT(!m_blockData.empty());
	DE_ASSERT(m_blockData.size() % tcu::astc::BLOCK_SIZE_BYTES == 0);

	m_testCtx.getLog() << TestLog::Message << "Total " << m_blockData.size() / tcu::astc::BLOCK_SIZE_BYTES << " blocks to test" << TestLog::EndMessage
					   << TestLog::Message << "Note: Legitimate ASTC error pixels will be ignored when comparing to reference" << TestLog::EndMessage;
}